

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sm83.cpp
# Opt level: O3

void __thiscall SM83::add_a_r(SM83 *this,u8 reg)

{
  byte bVar1;
  uint uVar2;
  u8 uVar3;
  uint uVar4;
  undefined7 in_register_00000031;
  
  bVar1 = (this->field_0).field_1.a;
  uVar2 = (uint)CONCAT71(in_register_00000031,reg);
  uVar4 = bVar1 + uVar2;
  uVar3 = (u8)uVar4;
  (this->field_0).field_1.f =
       (0xff < uVar4) << 4 | (this->field_0).field_1.f & 0xf | (uVar3 == '\0') << 7 |
       (0xf < (uVar2 & 0xf) + (bVar1 & 0xf)) << 5;
  (this->field_0).field_1.a = uVar3;
  return;
}

Assistant:

void SM83::add_a_r(u8 reg) {
    u16 result = a + reg;

    SetZeroFlag(static_cast<u8>(result) == 0);
    SetNegateFlag(false);
    SetHalfCarryFlag((a & 0xF) + (reg & 0xF) > 0xF);
    SetCarryFlag(result > 0xFF);

    a = static_cast<u8>(result);
}